

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O1

void __thiscall CECorrections::UpdateTtUt1Cache(CECorrections *this,double *mjd)

{
  vector<double,_std::allocator<double>_> *this_00;
  uint uVar1;
  iterator __first;
  iterator __last;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  reference y1;
  invalid_value *this_01;
  CECorrections *this_02;
  ulong __n;
  value_type vVar5;
  double mjd_lower;
  double mjd_upper;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((*mjd == this->cache_ttut1_mjd_) && (!NAN(*mjd) && !NAN(this->cache_ttut1_mjd_))) {
    return;
  }
  LoadTtUt1(this);
  this_00 = &this->ttut1_mjd_;
  __first = std::vector<double,_std::allocator<double>_>::begin(this_00);
  __last = std::vector<double,_std::allocator<double>_>::end(this_00);
  local_110._M_dataplus._M_p =
       (pointer)std::
                lower_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )__first._M_current,
                           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )__last._M_current,mjd);
  local_f0._M_dataplus._M_p = (pointer)std::vector<double,_std::allocator<double>_>::begin(this_00);
  uVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     &local_110,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     &local_f0);
  uVar1 = (int)uVar2 - 1;
  if (-1 < (int)uVar1) {
    __n = (ulong)uVar1;
    sVar3 = std::vector<double,_std::allocator<double>_>::size(this_00);
    if (__n < sVar3 - 1) {
      if (this->interp_ == false) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->ttut1_delt_,__n);
        vVar5 = *pvVar4;
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,__n);
        local_110._M_dataplus._M_p = (pointer)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (this_00,uVar2 & 0xffffffff);
        local_f0._M_dataplus._M_p = (pointer)*pvVar4;
        this_02 = (CECorrections *)&this->ttut1_delt_;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)this_02,__n);
        y1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)this_02,uVar2 & 0xffffffff);
        vVar5 = InterpValue(this_02,mjd,(double *)&local_110,(double *)&local_f0,pvVar4,y1);
      }
      this->cache_ttut1_delt_ = vVar5;
      this->cache_ttut1_mjd_ = *mjd;
      return;
    }
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::front(this_00);
  std::__cxx11::to_string(&local_110,*pvVar4);
  pvVar4 = std::vector<double,_std::allocator<double>_>::back(this_00);
  std::__cxx11::to_string(&local_f0,*pvVar4);
  std::__cxx11::to_string(&local_d0,*mjd);
  std::operator+(&local_b0,"Invalid mjd: ",&local_d0);
  std::operator+(&local_90,&local_b0,". Accepted ");
  std::operator+(&local_70,&local_90,"range is ");
  std::operator+(&local_130,&local_70,&local_110);
  std::operator+(&local_150,&local_130," - ");
  std::operator+(&local_50,&local_150,&local_f0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  this_01 = (invalid_value *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"UpdateTtUt1Cache",(allocator *)&local_130);
  CEException::invalid_value::invalid_value(this_01,&local_150,&local_50);
  __cxa_throw(this_01,&CEException::invalid_value::typeinfo,CEExceptionHandler::~CEExceptionHandler)
  ;
}

Assistant:

void CECorrections::UpdateTtUt1Cache(const double& mjd) const
{
    // Check if the nutation actually needs to be updated
    if (mjd != cache_ttut1_mjd_) {
        // Make sure nutation corrections are loaded
        LoadTtUt1();

        // Compute the closest index associated with the MJD
        int indx = (std::lower_bound(ttut1_mjd_.begin(), ttut1_mjd_.end(), mjd)
                    - ttut1_mjd_.begin()) - 1;

        // Make sure the MJD date is covered by stored correction values
        if ((indx < 0) || (indx >= ttut1_mjd_.size()-1)) {
            // TODO: Make this a warning message
            std::string min_mjd(std::to_string(ttut1_mjd_.front()));
            std::string max_mjd(std::to_string(ttut1_mjd_.back()));
            std::string msg = "Invalid mjd: " + std::to_string(mjd) + ". Accepted " +
                            "range is " + min_mjd + " - " + max_mjd;
            throw CEException::invalid_value(__func__, msg);
        } 

        // Get the uninterpolated value
        else if (!interp_) {
            cache_ttut1_delt_ = ttut1_delt_[indx];
        }
        
        // Otherwise interpolate between closest two values (a bit slower)
        else {
            double mjd_lower( ttut1_mjd_[indx] );
            double mjd_upper( ttut1_mjd_[indx+1] );
            
            cache_ttut1_delt_ = InterpValue(mjd, mjd_lower, mjd_upper,
                                            ttut1_delt_[indx], 
                                            ttut1_delt_[indx+1]);
        }

        cache_ttut1_mjd_  = mjd;
    }

    return;
}